

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  undefined1 uVar1;
  char cVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined1 *puVar5;
  tag **pptVar6;
  int iVar7;
  int iVar8;
  XML_Error XVar9;
  XML_Char *pXVar10;
  undefined8 uVar11;
  ATTRIBUTE_ID *attId_00;
  DEFAULT_ATTRIBUTE *pDVar12;
  NAMED *pNVar13;
  void *__dest;
  TAG *pTVar14;
  char *pcVar15;
  long lVar16;
  XML_Char *uri;
  TAG *p;
  XML_Char *s;
  BINDING *b;
  int j_2;
  ATTRIBUTE_ID *id;
  DEFAULT_ATTRIBUTE *da;
  int j_1;
  int j;
  int isCdata;
  XML_Error result;
  ATTRIBUTE_ID *attId;
  char *pcStack_70;
  int oldAttsSize;
  XML_Char *localPart;
  BINDING *binding;
  int nPrefixes;
  int n;
  int i;
  int attIndex;
  XML_Char **appAtts;
  ELEMENT_TYPE *pEStack_40;
  int nDefaultAtts;
  ELEMENT_TYPE *elementType;
  BINDING **bindingsPtr_local;
  TAG_NAME *tagNamePtr_local;
  char *attStr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  pEStack_40 = (ELEMENT_TYPE *)0x0;
  appAtts._4_4_ = 0;
  n = 0;
  binding._0_4_ = 0;
  if (tagNamePtr != (TAG_NAME *)0x0) {
    pEStack_40 = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),tagNamePtr->str,0);
    if (pEStack_40 == (ELEMENT_TYPE *)0x0) {
      pXVar10 = poolCopyString((STRING_POOL *)((long)parser + 0x330),tagNamePtr->str);
      tagNamePtr->str = pXVar10;
      if (tagNamePtr->str == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pEStack_40 = (ELEMENT_TYPE *)lookup((HASH_TABLE *)((long)parser + 0x2b8),tagNamePtr->str,0x28)
      ;
      if (pEStack_40 == (ELEMENT_TYPE *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if ((*(int *)((long)parser + 0x1c8) != 0) &&
         (iVar7 = setElementTypePrefix(parser,pEStack_40), iVar7 == 0)) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    appAtts._4_4_ = pEStack_40->nDefaultAtts;
  }
  iVar7 = (*enc->getAtts)(enc,attStr,*(int *)((long)parser + 0x3f0),
                          *(ATTRIBUTE **)((long)parser + 0x400));
  if (*(int *)((long)parser + 0x3f0) < iVar7 + appAtts._4_4_) {
    iVar8 = *(int *)((long)parser + 0x3f0);
    *(int *)((long)parser + 0x3f0) = iVar7 + appAtts._4_4_ + 0x10;
    uVar11 = (**(code **)((long)parser + 0x20))
                       (*(undefined8 *)((long)parser + 0x400),
                        (long)*(int *)((long)parser + 0x3f0) << 5);
    *(undefined8 *)((long)parser + 0x400) = uVar11;
    if (*(long *)((long)parser + 0x400) == 0) {
      return XML_ERROR_NO_MEMORY;
    }
    if (iVar8 < iVar7) {
      (*enc->getAtts)(enc,attStr,iVar7,*(ATTRIBUTE **)((long)parser + 0x400));
    }
  }
  lVar16 = *(long *)((long)parser + 0x400);
  for (nPrefixes = 0; nPrefixes < iVar7; nPrefixes = nPrefixes + 1) {
    pcVar15 = *(char **)(*(long *)((long)parser + 0x400) + (long)nPrefixes * 0x20);
    lVar3 = *(long *)(*(long *)((long)parser + 0x400) + (long)nPrefixes * 0x20);
    iVar8 = (*enc->nameLength)(enc,*(char **)(*(long *)((long)parser + 0x400) +
                                             (long)nPrefixes * 0x20));
    attId_00 = getAttributeId(parser,enc,pcVar15,(char *)(lVar3 + iVar8));
    if (attId_00 == (ATTRIBUTE_ID *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if (attId_00->name[-1] != '\0') {
      if (enc == *(ENCODING **)((long)parser + 0x118)) {
        *(undefined8 *)((long)parser + 0x218) =
             *(undefined8 *)(*(long *)((long)parser + 0x400) + (long)nPrefixes * 0x20);
      }
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    attId_00->name[-1] = '\x01';
    iVar8 = n + 1;
    *(XML_Char **)(lVar16 + (long)n * 8) = attId_00->name;
    if (*(char *)(*(long *)((long)parser + 0x400) + (long)nPrefixes * 0x20 + 0x18) == '\0') {
      j_1 = 1;
      if (attId_00->maybeTokenized != '\0') {
        for (da._4_4_ = 0; da._4_4_ < appAtts._4_4_; da._4_4_ = da._4_4_ + 1) {
          if (attId_00 == pEStack_40->defaultAtts[da._4_4_].id) {
            j_1 = (int)pEStack_40->defaultAtts[da._4_4_].isCdata;
            break;
          }
        }
      }
      XVar9 = storeAttributeValue(parser,enc,j_1,
                                  *(char **)(*(long *)((long)parser + 0x400) +
                                             (long)nPrefixes * 0x20 + 8),
                                  *(char **)(*(long *)((long)parser + 0x400) +
                                             (long)nPrefixes * 0x20 + 0x10),
                                  (STRING_POOL *)((long)parser + 0x418));
      if (XVar9 != XML_ERROR_NONE) {
        return XVar9;
      }
      if (tagNamePtr == (TAG_NAME *)0x0) {
        *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
      }
      else {
        *(undefined8 *)(lVar16 + (long)iVar8 * 8) = *(undefined8 *)((long)parser + 0x438);
        *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      }
    }
    else if (tagNamePtr != (TAG_NAME *)0x0) {
      pXVar10 = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,
                                *(char **)(*(long *)((long)parser + 0x400) + (long)nPrefixes * 0x20
                                          + 8),
                                *(char **)(*(long *)((long)parser + 0x400) + (long)nPrefixes * 0x20
                                          + 0x10));
      *(XML_Char **)(lVar16 + (long)iVar8 * 8) = pXVar10;
      if (*(long *)(lVar16 + (long)iVar8 * 8) == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
    }
    if ((attId_00->prefix == (PREFIX *)0x0) || (tagNamePtr == (TAG_NAME *)0x0)) {
      n = n + 2;
    }
    else if (attId_00->xmlns == '\0') {
      n = n + 2;
      binding._0_4_ = (int)binding + 1;
      attId_00->name[-1] = '\x02';
    }
    else {
      iVar8 = addBinding(parser,attId_00->prefix,attId_00,*(XML_Char **)(lVar16 + (long)iVar8 * 8),
                         bindingsPtr);
      if (iVar8 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
  }
  if (tagNamePtr != (TAG_NAME *)0x0) {
    *(int *)((long)parser + 0x3f4) = n;
    if ((pEStack_40->idAtt == (ATTRIBUTE_ID *)0x0) || (pEStack_40->idAtt->name[-1] == '\0')) {
      *(undefined4 *)((long)parser + 0x3f8) = 0xffffffff;
    }
    else {
      for (nPrefixes = 0; nPrefixes < n; nPrefixes = nPrefixes + 2) {
        if (*(XML_Char **)(lVar16 + (long)nPrefixes * 8) == pEStack_40->idAtt->name) {
          *(int *)((long)parser + 0x3f8) = nPrefixes;
          break;
        }
      }
    }
    for (da._0_4_ = 0; (int)da < appAtts._4_4_; da._0_4_ = (int)da + 1) {
      pDVar12 = pEStack_40->defaultAtts + (int)da;
      if ((pDVar12->id->name[-1] == '\0') && (pDVar12->value != (XML_Char *)0x0)) {
        if (pDVar12->id->prefix == (PREFIX *)0x0) {
          pDVar12->id->name[-1] = '\x01';
          iVar7 = n + 1;
          *(XML_Char **)(lVar16 + (long)n * 8) = pDVar12->id->name;
          n = n + 2;
          *(XML_Char **)(lVar16 + (long)iVar7 * 8) = pDVar12->value;
        }
        else if (pDVar12->id->xmlns == '\0') {
          pDVar12->id->name[-1] = '\x02';
          binding._0_4_ = (int)binding + 1;
          iVar7 = n + 1;
          *(XML_Char **)(lVar16 + (long)n * 8) = pDVar12->id->name;
          n = n + 2;
          *(XML_Char **)(lVar16 + (long)iVar7 * 8) = pDVar12->value;
        }
        else {
          iVar7 = addBinding(parser,pDVar12->id->prefix,pDVar12->id,pDVar12->value,bindingsPtr);
          if (iVar7 == 0) {
            return XML_ERROR_NO_MEMORY;
          }
        }
      }
    }
    *(undefined8 *)(lVar16 + (long)n * 8) = 0;
  }
  nPrefixes = 0;
  if ((int)binding != 0) {
    for (; nPrefixes < n; nPrefixes = nPrefixes + 2) {
      if (*(char *)(*(long *)(lVar16 + (long)nPrefixes * 8) + -1) == '\x02') {
        *(undefined1 *)(*(long *)(lVar16 + (long)nPrefixes * 8) + -1) = 0;
        pNVar13 = lookup((HASH_TABLE *)((long)parser + 0x2e0),*(KEY *)(lVar16 + (long)nPrefixes * 8)
                         ,0);
        if (*(long *)(pNVar13[1].name + 8) != 0) {
          puVar4 = *(undefined8 **)(pNVar13[1].name + 8);
          p = *(TAG **)(lVar16 + (long)nPrefixes * 8);
          for (b._4_4_ = 0; b._4_4_ < *(int *)(puVar4 + 5); b._4_4_ = b._4_4_ + 1) {
            if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
               (iVar7 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar7 == 0)) {
              return XML_ERROR_NO_MEMORY;
            }
            uVar1 = *(undefined1 *)(puVar4[4] + (long)b._4_4_);
            puVar5 = *(undefined1 **)((long)parser + 0x430);
            *(undefined1 **)((long)parser + 0x430) = puVar5 + 1;
            *puVar5 = uVar1;
          }
          do {
            pTVar14 = (TAG *)((long)&p->parent + 1);
            pptVar6 = &p->parent;
            p = pTVar14;
          } while (*(char *)pptVar6 != ':');
          do {
            if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
               (iVar7 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar7 == 0)) {
              return XML_ERROR_NO_MEMORY;
            }
            uVar1 = *(undefined1 *)&p->parent;
            puVar5 = *(undefined1 **)((long)parser + 0x430);
            *(undefined1 **)((long)parser + 0x430) = puVar5 + 1;
            *puVar5 = uVar1;
            pptVar6 = &p->parent;
            p = (TAG *)((long)&p->parent + 1);
          } while (*(char *)pptVar6 != '\0');
          if (*(int *)((long)parser + 0x1cc) != 0) {
            *(undefined1 *)(*(long *)((long)parser + 0x430) + -1) =
                 *(undefined1 *)((long)parser + 0x488);
            p = *(TAG **)*puVar4;
            do {
              if ((*(long *)((long)parser + 0x430) == *(long *)((long)parser + 0x428)) &&
                 (iVar7 = poolGrow((STRING_POOL *)((long)parser + 0x418)), iVar7 == 0)) {
                return XML_ERROR_NO_MEMORY;
              }
              uVar1 = *(undefined1 *)&p->parent;
              puVar5 = *(undefined1 **)((long)parser + 0x430);
              *(undefined1 **)((long)parser + 0x430) = puVar5 + 1;
              *puVar5 = uVar1;
              pptVar6 = &p->parent;
              p = (TAG *)((long)&p->parent + 1);
            } while (*(char *)pptVar6 != '\0');
          }
          *(undefined8 *)(lVar16 + (long)nPrefixes * 8) = *(undefined8 *)((long)parser + 0x438);
          *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
        }
        binding._0_4_ = (int)binding + -1;
        if ((int)binding == 0) break;
      }
      else {
        *(undefined1 *)(*(long *)(lVar16 + (long)nPrefixes * 8) + -1) = 0;
      }
    }
  }
  for (; nPrefixes < n; nPrefixes = nPrefixes + 2) {
    *(undefined1 *)(*(long *)(lVar16 + (long)nPrefixes * 8) + -1) = 0;
  }
  if (tagNamePtr != (TAG_NAME *)0x0) {
    for (localPart = (XML_Char *)*bindingsPtr; localPart != (XML_Char *)0x0;
        localPart = *(XML_Char **)(localPart + 8)) {
      *(undefined1 *)(**(long **)(localPart + 0x18) + -1) = 0;
    }
    if (pEStack_40->prefix == (PREFIX *)0x0) {
      if (*(long *)((long)parser + 0x398) == 0) {
        return XML_ERROR_NONE;
      }
      localPart = *(XML_Char **)((long)parser + 0x398);
      pcStack_70 = tagNamePtr->str;
    }
    else {
      localPart = (XML_Char *)pEStack_40->prefix->binding;
      if ((BINDING *)localPart == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcStack_70 = tagNamePtr->str;
      do {
        pcVar15 = pcStack_70 + 1;
        cVar2 = *pcStack_70;
        pcStack_70 = pcVar15;
      } while (cVar2 != ':');
    }
    tagNamePtr->localPart = pcStack_70;
    tagNamePtr->uriLen = *(int *)(localPart + 0x28);
    nPrefixes = 0;
    do {
      iVar7 = nPrefixes + 1;
      lVar16 = (long)nPrefixes;
      nPrefixes = iVar7;
    } while (pcStack_70[lVar16] != '\0');
    iVar8 = iVar7 + *(int *)(localPart + 0x28);
    if (*(int *)(localPart + 0x2c) < iVar8) {
      __dest = (void *)(**(code **)((long)parser + 0x18))((long)(iVar8 + 0x18));
      if (__dest == (void *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(int *)(localPart + 0x2c) = iVar8 + 0x18;
      memcpy(__dest,*(void **)(localPart + 0x20),(long)*(int *)(localPart + 0x28));
      for (uri = *(XML_Char **)((long)parser + 0x3d0); uri != (XML_Char *)0x0;
          uri = *(XML_Char **)uri) {
        if (*(long *)(uri + 0x18) == *(long *)(localPart + 0x20)) {
          *(void **)(uri + 0x18) = __dest;
        }
      }
      (**(code **)((long)parser + 0x28))(*(undefined8 *)(localPart + 0x20));
      *(void **)(localPart + 0x20) = __dest;
    }
    memcpy((void *)(*(long *)(localPart + 0x20) + (long)*(int *)(localPart + 0x28)),pcStack_70,
           (long)iVar7);
    tagNamePtr->str = *(XML_Char **)(localPart + 0x20);
  }
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error storeAtts(XML_Parser parser, const ENCODING *enc,
                                const char *attStr, TAG_NAME *tagNamePtr,
                                BINDING **bindingsPtr)
{
  ELEMENT_TYPE *elementType = 0;
  int nDefaultAtts = 0;
  const XML_Char **appAtts;   /* the attribute list to pass to the application */
  int attIndex = 0;
  int i;
  int n;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  if (tagNamePtr) {
    elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str,0);
    if (!elementType) {
      tagNamePtr->str = poolCopyString(&dtd.pool, tagNamePtr->str);
      if (!tagNamePtr->str)
        return XML_ERROR_NO_MEMORY;
      elementType = (ELEMENT_TYPE *)lookup(&dtd.elementTypes, tagNamePtr->str, sizeof(ELEMENT_TYPE));
      if (!elementType)
        return XML_ERROR_NO_MEMORY;
      if (ns && !setElementTypePrefix(parser, elementType))
        return XML_ERROR_NO_MEMORY;
    }
    nDefaultAtts = elementType->nDefaultAtts;
  }
  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, attsSize, atts);
  if (n + nDefaultAtts > attsSize) {
    int oldAttsSize = attsSize;
    attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    atts = REALLOC((void *)atts, attsSize * sizeof(ATTRIBUTE));
    if (!atts)
      return XML_ERROR_NO_MEMORY;
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, atts);
  }
  appAtts = (const XML_Char **)atts;
  for (i = 0; i < n; i++) {
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, atts[i].name,
                                         atts[i].name
                                         + XmlNameLength(enc, atts[i].name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
    /* detect duplicate attributes */
    if ((attId->name)[-1]) {
      if (enc == encoding)
        eventPtr = atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!atts[i].normalized) {
      enum XML_Error result;
      int isCdata = 1;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   atts[i].valuePtr, atts[i].valueEnd,
                                   &tempPool);
      if (result)
        return result;
      if (tagNamePtr) {
        appAtts[attIndex] = poolStart(&tempPool);
        poolFinish(&tempPool);
      }
      else
        poolDiscard(&tempPool);
    }
    else if (tagNamePtr) {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&tempPool, enc, atts[i].valuePtr, atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix && tagNamePtr) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        if (!addBinding(parser, attId->prefix, attId, appAtts[attIndex], bindingsPtr))
          return XML_ERROR_NO_MEMORY;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }
  if (tagNamePtr) {
    int j;
    nSpecifiedAtts = attIndex;
    if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
      for (i = 0; i < attIndex; i += 2)
        if (appAtts[i] == elementType->idAtt->name) {
          idAttIndex = i;
          break;
        }
    }
    else
      idAttIndex = -1;
    /* do attribute defaulting */
    for (j = 0; j < nDefaultAtts; j++) {
      const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + j;
      if (!(da->id->name)[-1] && da->value) {
        if (da->id->prefix) {
          if (da->id->xmlns) {
            if (!addBinding(parser, da->id->prefix, da->id, da->value, bindingsPtr))
              return XML_ERROR_NO_MEMORY;
          }
          else {
            (da->id->name)[-1] = 2;
            nPrefixes++;
            appAtts[attIndex++] = da->id->name;
            appAtts[attIndex++] = da->value;
          }
        }
        else {
          (da->id->name)[-1] = 1;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
    }
    appAtts[attIndex] = 0;
  }
  i = 0;
  if (nPrefixes) {
    /* expand prefixed attribute names */
    for (; i < attIndex; i += 2) {
      if (appAtts[i][-1] == 2) {
        ATTRIBUTE_ID *id;
        ((XML_Char *)(appAtts[i]))[-1] = 0;
        id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, appAtts[i], 0);
        if (id->prefix->binding) {
          int j;
          const BINDING *b = id->prefix->binding;
          const XML_Char *s = appAtts[i];
          for (j = 0; j < b->uriLen; j++) {
            if (!poolAppendChar(&tempPool, b->uri[j]))
              return XML_ERROR_NO_MEMORY;
          }
          while (*s++ != ':')
            ;
          do {
            if (!poolAppendChar(&tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
          if (ns_triplets) {
            tempPool.ptr[-1] = namespaceSeparator;
            s = b->prefix->name;
            do {
              if (!poolAppendChar(&tempPool, *s))
                return XML_ERROR_NO_MEMORY;
            } while (*s++);
          }

          appAtts[i] = poolStart(&tempPool);
          poolFinish(&tempPool);
        }
        if (!--nPrefixes)
          break;
      }
      else
        ((XML_Char *)(appAtts[i]))[-1] = 0;
    }
  }
  /* clear the flags that say whether attributes were specified */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  if (!tagNamePtr)
    return XML_ERROR_NONE;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;
  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_NONE;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(':'))
      ;
  }
  else if (dtd.defaultPrefix.binding) {
    binding = dtd.defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  for (i = 0; localPart[i++];)
    ;
  n = i + binding->uriLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    XML_Char *uri = MALLOC((n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(binding->uri);
    binding->uri = uri;
  }
  memcpy(binding->uri + binding->uriLen, localPart, i * sizeof(XML_Char));
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}